

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  char *__s;
  Type TVar1;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  string *psVar2;
  allocator<char> local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *this_local;
  
  local_18 = this;
  this_local = (FieldDescriptor *)__return_storage_ptr__;
  TVar1 = type(this);
  if (TVar1 == TYPE_MESSAGE) {
    this_00 = message_type(this);
    psVar2 = Descriptor::full_name_abi_cxx11_(this_00);
    std::operator+(__return_storage_ptr__,".",psVar2);
  }
  else if (TVar1 == TYPE_ENUM) {
    this_01 = enum_type(this);
    psVar2 = EnumDescriptor::full_name_abi_cxx11_(this_01);
    std::operator+(__return_storage_ptr__,".",psVar2);
  }
  else {
    TVar1 = type(this);
    __s = *(char **)(kTypeToName + (ulong)TVar1 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldDescriptor::FieldTypeNameDebugString() const {
  switch(type()) {
    case TYPE_MESSAGE:
      return "." + message_type()->full_name();
    case TYPE_ENUM:
      return "." + enum_type()->full_name();
    default:
      return kTypeToName[type()];
  }
}